

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

string * __thiscall toml::detail::character::name_abi_cxx11_(character *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int in_stack_ffffffffffffffec;
  
  __lhs = &local_50;
  show_char_abi_cxx11_(in_stack_ffffffffffffffec);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string character::name() const
{
    return "character{" + show_char(value_) + "}";
}